

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::determine_color_endpoints(dxt_hc *this)

{
  ushort uVar1;
  int iVar2;
  task_pool *this_00;
  undefined8 x;
  undefined4 uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  tile_details *ptVar7;
  tile_details *ptVar8;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar9;
  ulong data;
  Node *pNVar10;
  size_type sVar11;
  const_reference pvVar12;
  vec<6U,_float> *pvVar13;
  uint *puVar14;
  color_cluster *pcVar15;
  endpoint_indices_details *peVar16;
  code *pObject_method;
  color_quad<unsigned_char,_int> *local_3d0;
  uint local_210;
  uint local_20c;
  uint i_4;
  uint p;
  color_quad_u8 mirror [16];
  uint local_1b8;
  uint cluster_index;
  uint b;
  uint t_1;
  undefined8 local_1a8;
  uint local_19c;
  undefined1 local_198 [4];
  uint i_3;
  tree_clusterizer<crnlib::vec<6U,_float>_> vq;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *endpoint;
  Node node_1;
  undefined1 local_d0 [8];
  vector<unsigned_int> weights;
  vector<crnlib::vec<6U,_float>_> vectors;
  undefined1 local_a8 [4];
  uint i_2;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> queue;
  uint i_1;
  uint i;
  Node node;
  vector<Node>_conflict nodes;
  pair<crnlib::vec<6U,_float>,_unsigned_int> local_58;
  uint local_2c;
  undefined1 local_28 [4];
  uint t;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> endpoints;
  uint num_tasks;
  dxt_hc *this_local;
  
  uVar5 = task_pool::get_num_threads(this->m_pTask_pool);
  endpoints.m_capacity = uVar5 + 1;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::vector
            ((vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)local_28);
  for (local_2c = 0; uVar6 = local_2c,
      uVar5 = vector<crnlib::dxt_hc::tile_details>::size(&this->m_tiles), uVar6 < uVar5;
      local_2c = local_2c + 1) {
    ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,local_2c);
    uVar5 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar7->pixels);
    if (uVar5 != 0) {
      ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,local_2c);
      ptVar8 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,local_2c);
      uVar5 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar8->pixels);
      ptVar8 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,local_2c);
      nodes.m_capacity = (uint)(long)((float)uVar5 * ptVar8->weight);
      std::make_pair<crnlib::vec<6u,float>&,unsigned_int>
                (&local_58,&ptVar7->color_endpoint,&nodes.m_capacity);
      vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::push_back
                ((vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)local_28,&local_58);
    }
  }
  vector<Node>::vector((vector<Node> *)&node.pEnd);
  ppVar9 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::get_ptr
                     ((vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)local_28);
  determine_color_endpoints()::Node::Node(std::pair<crnlib::vec<6u,float>,unsigned_int>*,std::
  pair<crnlib::vec<6u,float>_unsigned_int>__
            (&i_1,(pair<crnlib::vec<6U,_float>,_unsigned_int> *)0x0,ppVar9);
  for (queue._28_4_ = 0; (uint)queue._28_4_ < endpoints.m_capacity; queue._28_4_ = queue._28_4_ + 1)
  {
    _i_1 = node.p;
    ppVar9 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::get_ptr
                       ((vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)local_28);
    uVar5 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::size
                      ((vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)local_28);
    node.p = ppVar9 + (ulong)(uVar5 * (queue._28_4_ + 1)) / (ulong)endpoints.m_capacity;
    if (_i_1 != node.p) {
      vector<Node>::push_back((vector<Node> *)&node.pEnd,(Node *)&i_1);
    }
  }
  for (queue._24_4_ = 0; uVar3 = queue._24_4_,
      uVar5 = vector<Node>::size((vector<Node> *)&node.pEnd), (uint)uVar3 < uVar5;
      queue._24_4_ = queue._24_4_ + 1) {
    this_00 = this->m_pTask_pool;
    data = (ulong)(uint)queue._24_4_;
    pNVar10 = vector<Node>::operator[]((vector<Node> *)&node.pEnd,queue._24_4_);
    task_pool::queue_task(this_00,determine_color_endpoints::Node::sort_task,data,pNVar10);
  }
  task_pool::join(this->m_pTask_pool);
  std::
  priority_queue<crnlib::dxt_hc::determine_color_endpoints()::Node,std::vector<crnlib::dxt_hc::determine_color_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_color_endpoints()::Node>>,std::less<crnlib::dxt_hc::determine_color_endpoints()::Node>>
  ::
  priority_queue<std::vector<crnlib::dxt_hc::determine_color_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_color_endpoints()::Node>>,void>
            ((priority_queue<crnlib::dxt_hc::determine_color_endpoints()::Node,std::vector<crnlib::dxt_hc::determine_color_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_color_endpoints()::Node>>,std::less<crnlib::dxt_hc::determine_color_endpoints()::Node>>
              *)local_a8);
  for (vectors.m_capacity = 0; uVar5 = vector<Node>::size((vector<Node> *)&node.pEnd),
      vectors.m_capacity < uVar5; vectors.m_capacity = vectors.m_capacity + 1) {
    pNVar10 = vector<Node>::operator[]((vector<Node> *)&node.pEnd,vectors.m_capacity);
    std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
              ((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> *)
               local_a8,pNVar10);
  }
  vector<crnlib::vec<6U,_float>_>::vector((vector<crnlib::vec<6U,_float>_> *)&weights.m_size);
  vector<unsigned_int>::vector((vector<unsigned_int> *)local_d0);
  uVar5 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::size
                    ((vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)local_28);
  vector<crnlib::vec<6U,_float>_>::reserve((vector<crnlib::vec<6U,_float>_> *)&weights.m_size,uVar5)
  ;
  uVar5 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::size
                    ((vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)local_28);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)local_d0,uVar5);
LAB_001d3804:
  do {
    sVar11 = std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::
             size((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>
                   *)local_a8);
    if (sVar11 == 0) {
      tree_clusterizer<crnlib::vec<6U,_float>_>::tree_clusterizer
                ((tree_clusterizer<crnlib::vec<6U,_float>_> *)local_198);
      pvVar13 = vector<crnlib::vec<6U,_float>_>::get_ptr
                          ((vector<crnlib::vec<6U,_float>_> *)&weights.m_size);
      puVar14 = vector<unsigned_int>::get_ptr((vector<unsigned_int> *)local_d0);
      uVar5 = vector<crnlib::vec<6U,_float>_>::size
                        ((vector<crnlib::vec<6U,_float>_> *)&weights.m_size);
      uVar6 = math::minimum<unsigned_int>
                        (this->m_num_tiles,(this->m_params).m_color_endpoint_codebook_size);
      tree_clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                ((tree_clusterizer<crnlib::vec<6U,_float>_> *)local_198,pvVar13,puVar14,uVar5,uVar6,
                 true,this->m_pTask_pool);
      uVar5 = tree_clusterizer<crnlib::vec<6U,_float>_>::get_codebook_size
                        ((tree_clusterizer<crnlib::vec<6U,_float>_> *)local_198);
      vector<crnlib::dxt_hc::color_cluster>::resize(&this->m_color_clusters,uVar5,false);
      for (local_19c = 0; uVar6 = local_19c, uVar5 = task_pool::get_num_threads(this->m_pTask_pool),
          uVar6 <= uVar5; local_19c = local_19c + 1) {
        _b = determine_color_endpoint_clusters_task;
        local_1a8 = 0;
        task_pool::
        queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                  (this->m_pTask_pool,this,0x1d8830,0,(void *)(ulong)local_19c);
      }
      task_pool::join(this->m_pTask_pool);
      for (cluster_index = 0; cluster_index < this->m_num_blocks; cluster_index = cluster_index + 1)
      {
        ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,cluster_index);
        uVar5 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar7->pixels);
        if (uVar5 != 0) {
          ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,cluster_index);
          pcVar15 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                              (&this->m_color_clusters,(uint)ptVar7->cluster_indices[0]);
          ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,cluster_index);
          vector<crnlib::color_quad<unsigned_char,_int>_>::append(&pcVar15->pixels,&ptVar7->pixels);
        }
      }
      for (local_1b8 = 0; local_1b8 < this->m_num_blocks; local_1b8 = local_1b8 + 1) {
        puVar14 = vector<unsigned_int>::operator[](&this->m_tile_indices,local_1b8);
        ptVar7 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,*puVar14);
        uVar1 = ptVar7->cluster_indices[0];
        peVar16 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                            (&this->m_endpoint_indices,local_1b8);
        (peVar16->field_0).field_0.color = uVar1;
        pcVar15 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                            (&this->m_color_clusters,(uint)uVar1);
        vector<unsigned_int>::push_back(pcVar15->blocks,&local_1b8);
        if ((((this->m_has_subblocks & 1U) != 0) &&
            (peVar16 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                 (&this->m_endpoint_indices,local_1b8), peVar16->reference != '\0'))
           && (peVar16 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                   (&this->m_endpoint_indices,local_1b8 - 1),
              (uint)uVar1 == (uint)(peVar16->field_0).field_0.color)) {
          peVar16 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                              (&this->m_endpoint_indices,local_1b8);
          if ((int)(uint)peVar16->reference >> 1 != 0) {
            local_3d0 = (color_quad<unsigned_char,_int> *)&i_4;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_3d0);
              local_3d0 = local_3d0 + 1;
            } while (local_3d0 != mirror + 0xe);
            for (local_20c = 0; local_20c < 0x10; local_20c = local_20c + 1) {
              color_quad<unsigned_char,_int>::operator=
                        ((color_quad<unsigned_char,_int> *)(&i_4 + local_20c),
                         this->m_blocks[local_1b8 >> 1] + ((local_20c & 3) << 2 | local_20c >> 2));
            }
            memcpy(this->m_blocks + (local_1b8 >> 1),&i_4,0x40);
          }
          peVar16 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                              (&this->m_endpoint_indices,local_1b8);
          peVar16->reference = '\0';
        }
      }
      for (local_210 = 0; uVar5 = task_pool::get_num_threads(this->m_pTask_pool), local_210 <= uVar5
          ; local_210 = local_210 + 1) {
        pObject_method = determine_color_endpoint_codebook_task;
        if ((this->m_has_etc_color_blocks & 1U) != 0) {
          pObject_method = determine_color_endpoint_codebook_task_etc;
        }
        task_pool::
        queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                  (this->m_pTask_pool,this,(offset_in_dxt_hc_to_subr)pObject_method,0,
                   (void *)(ulong)local_210);
      }
      task_pool::join(this->m_pTask_pool);
      tree_clusterizer<crnlib::vec<6U,_float>_>::~tree_clusterizer
                ((tree_clusterizer<crnlib::vec<6U,_float>_> *)local_198);
      vector<unsigned_int>::~vector((vector<unsigned_int> *)local_d0);
      vector<crnlib::vec<6U,_float>_>::~vector((vector<crnlib::vec<6U,_float>_> *)&weights.m_size);
      std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::
      ~priority_queue((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>
                       *)local_a8);
      vector<Node>::~vector((vector<Node> *)&node.pEnd);
      vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::~vector
                ((vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)local_28);
      return;
    }
    pvVar12 = std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>
              ::top((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>
                     *)local_a8);
    vq.m_codebook._8_8_ = pvVar12->p;
    node_1.p = pvVar12->pEnd;
    endpoint = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)(vq.m_codebook._8_8_ + 0x1c);
    std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::pop
              ((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> *)
               local_a8);
    if (endpoint != node_1.p) {
      std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                ((priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> *
                 )local_a8,(value_type *)&endpoint);
    }
    uVar5 = vector<crnlib::vec<6U,_float>_>::size
                      ((vector<crnlib::vec<6U,_float>_> *)&weights.m_size);
    x = vq.m_codebook._8_8_;
    if (uVar5 != 0) {
      pvVar13 = vector<crnlib::vec<6U,_float>_>::back
                          ((vector<crnlib::vec<6U,_float>_> *)&weights.m_size);
      bVar4 = helpers::operator!=((vec<6U,_float> *)x,pvVar13);
      if (!bVar4) {
        puVar14 = vector<unsigned_int>::back((vector<unsigned_int> *)local_d0);
        if (-*(int *)(vq.m_codebook._8_8_ + 0x18) - 1U < *puVar14) {
          puVar14 = vector<unsigned_int>::back((vector<unsigned_int> *)local_d0);
          *puVar14 = 0xffffffff;
        }
        else {
          iVar2 = *(int *)(vq.m_codebook._8_8_ + 0x18);
          puVar14 = vector<unsigned_int>::back((vector<unsigned_int> *)local_d0);
          *puVar14 = iVar2 + *puVar14;
        }
        goto LAB_001d3804;
      }
    }
    vector<crnlib::vec<6U,_float>_>::push_back
              ((vector<crnlib::vec<6U,_float>_> *)&weights.m_size,
               (vec<6U,_float> *)vq.m_codebook._8_8_);
    vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)local_d0,(uint *)(vq.m_codebook._8_8_ + 0x18));
  } while( true );
}

Assistant:

void dxt_hc::determine_color_endpoints()
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        crnlib::vector<std::pair<vec6F, uint>> endpoints;
        for (uint t = 0; t < m_tiles.size(); t++)
        {
            if (m_tiles[t].pixels.size())
            {
                endpoints.push_back(std::make_pair(m_tiles[t].color_endpoint, (uint)(m_tiles[t].pixels.size() * m_tiles[t].weight)));
            }
        }

        struct Node
        {
            std::pair<vec6F, uint>*p, *pEnd;
            Node(std::pair<vec6F, uint>* begin, std::pair<vec6F, uint>* end) :
                p(begin), pEnd(end)
            {
            }
            bool operator<(const Node& other) const
            {
                return *p > *other.p;
            }
            static void sort_task(uint64 data, void* ptr)
            {
                std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd);
            }
        };

        crnlib::vector<Node> nodes;
        Node node(0, endpoints.get_ptr());
        for (uint i = 0; i < num_tasks; i++)
        {
            node.p = node.pEnd;
            node.pEnd = endpoints.get_ptr() + endpoints.size() * (i + 1) / num_tasks;
            if (node.p != node.pEnd)
            {
                nodes.push_back(node);
            }
        }

        for (uint i = 0; i < nodes.size(); i++)
        {
            m_pTask_pool->queue_task(&Node::sort_task, i, &nodes[i]);
        }
        m_pTask_pool->join();

        std::priority_queue<Node> queue;
        for (uint i = 0; i < nodes.size(); i++)
        {
            queue.push(nodes[i]);
        }

        crnlib::vector<vec6F> vectors;
        crnlib::vector<uint> weights;
        vectors.reserve(endpoints.size());
        weights.reserve(endpoints.size());
        while (queue.size())
        {
            Node node = queue.top();
            std::pair<vec6F, uint>* endpoint = node.p++;
            queue.pop();
            if(node.p != node.pEnd)
            {
                queue.push(node);
            }
            if (!vectors.size() || endpoint->first != vectors.back())
            {
                vectors.push_back(endpoint->first);
                weights.push_back(endpoint->second);
            }
            else if (weights.back() > UINT_MAX - endpoint->second)
            {
                weights.back() = UINT_MAX;
            }
            else
            {
                weights.back() += endpoint->second;
            }
        }

        tree_clusterizer<vec6F> vq;
        vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), math::minimum<uint>(m_num_tiles, m_params.m_color_endpoint_codebook_size), true, m_pTask_pool);
        m_color_clusters.resize(vq.get_codebook_size());

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &dxt_hc::determine_color_endpoint_clusters_task, i, &vq);
        }
        m_pTask_pool->join();

        for (uint t = 0; t < m_num_blocks; t++)
        {
            if (m_tiles[t].pixels.size())
            {
                m_color_clusters[m_tiles[t].cluster_indices[cColor]].pixels.append(m_tiles[t].pixels);
            }
        }

        for (uint b = 0; b < m_num_blocks; b++)
        {
            uint cluster_index = m_tiles[m_tile_indices[b]].cluster_indices[cColor];
            m_endpoint_indices[b].component[cColor] = cluster_index;
            m_color_clusters[cluster_index].blocks[cColor].push_back(b);
            if (m_has_subblocks && m_endpoint_indices[b].reference && cluster_index == m_endpoint_indices[b - 1].component[cColor])
            {
                if (m_endpoint_indices[b].reference >> 1)
                {
                    color_quad_u8 mirror[16];
                    for (uint p = 0; p < 16; p++)
                    {
                        mirror[p] = m_blocks[b >> 1][(p << 2 & 12) | p >> 2];
                    }
                    memcpy(m_blocks[b >> 1], mirror, 64);
                }
                m_endpoint_indices[b].reference = 0;
            }
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, m_has_etc_color_blocks ? &dxt_hc::determine_color_endpoint_codebook_task_etc : &dxt_hc::determine_color_endpoint_codebook_task, i, nullptr);
        }
        m_pTask_pool->join();
    }